

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanodetplus_pnnx.cpp
# Opt level: O0

void generate_proposals(Mat *pred,int stride,Mat *in_pad,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  int in_ESI;
  long *in_RDI;
  float in_XMM0_Da;
  Object obj;
  float y1;
  float x1;
  float y0;
  float x0;
  float pb_cy;
  float pb_cx;
  int l;
  float *dis_after_sm;
  float dis;
  int k_2;
  float pred_ltrb [4];
  Option opt;
  ParamDict pd;
  Layer *softmax;
  int k_1;
  Mat bbox_pred;
  float s;
  int k;
  float score;
  int label;
  int j;
  int i;
  int reg_max_1;
  int num_class;
  int num_grid_y;
  int num_grid_x;
  int num_grid;
  Mat *m_1;
  Mat *m;
  char *in_stack_fffffffffffffb48;
  Option *in_stack_fffffffffffffb50;
  value_type *in_stack_fffffffffffffb58;
  Layer *in_stack_fffffffffffffb60;
  Layer *in_stack_fffffffffffffb68;
  Mat *in_stack_fffffffffffffb70;
  int local_3ec;
  float local_3e0;
  int local_3dc;
  float local_3d8 [6];
  undefined1 local_3c0 [4];
  undefined4 local_3bc;
  undefined1 local_399;
  ParamDict local_380;
  Layer *local_370;
  Mat local_368;
  int local_31c;
  undefined1 local_318 [32];
  long *local_2f8;
  undefined4 local_2f0;
  int local_2ec;
  int local_2e8;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined4 local_2a8;
  long local_2a0;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined8 local_280;
  float local_274;
  int local_270;
  float local_26c;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  undefined4 local_258;
  int local_254;
  int local_250;
  undefined4 local_24c;
  float local_23c;
  int local_22c;
  long *local_228;
  undefined8 *local_220;
  Mat *local_210;
  Option *local_200;
  undefined1 local_1ed;
  int local_1ec;
  Mat *local_1e0;
  undefined1 local_1cd;
  int local_1cc;
  undefined8 *local_1c0;
  int local_1ac;
  Mat *local_1a8;
  int local_19c;
  undefined8 *local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined4 local_180;
  int local_17c;
  undefined1 *local_178;
  long local_170;
  undefined1 *local_168;
  int local_15c;
  undefined1 *local_158;
  long local_150;
  undefined4 local_144;
  long local_140;
  long local_138;
  undefined4 local_12c;
  int local_128;
  int local_124;
  undefined8 *local_120;
  Allocator *local_118;
  undefined4 local_10c;
  long local_108;
  long local_100;
  undefined4 local_f4;
  int local_f0;
  int local_ec;
  Mat *local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  int local_90;
  undefined4 local_8c;
  Option *local_88;
  Mat *local_68;
  undefined8 *local_48;
  void *local_20;
  
  local_24c = (undefined4)in_RDI[6];
  local_250 = *(int *)((long)in_RDI + 0x2c);
  local_254 = (int)in_RDI[6];
  local_258 = 0x50;
  local_25c = ((int)in_RDI[7] + -0x50) / 4;
  local_23c = in_XMM0_Da;
  local_22c = in_ESI;
  local_228 = in_RDI;
  for (local_260 = 0; local_260 < local_254; local_260 = local_260 + 1) {
    for (local_264 = 0; local_264 < local_250; local_264 = local_264 + 1) {
      local_268 = -1;
      local_26c = -3.4028235e+38;
      for (local_270 = 0; local_270 < 0x50; local_270 = local_270 + 1) {
        local_1c0 = &local_2c0;
        local_124 = *(int *)((long)local_228 + 0x2c);
        local_128 = (int)local_228[6];
        local_12c = *(undefined4 *)((long)local_228 + 0x34);
        local_138 = *local_228 + local_228[8] * (long)local_270 * local_228[2];
        local_140 = local_228[2];
        local_144 = (undefined4)local_228[3];
        local_150 = local_228[4];
        local_120 = &local_2c0;
        local_c8 = (long)local_124 * (long)local_128 * local_140;
        local_cc = 0x10;
        local_1cc = local_270;
        local_1cd = 1;
        local_198 = &local_2c0;
        local_19c = local_260;
        local_274 = *(float *)(local_138 + (long)local_124 * (long)local_260 * local_140 +
                              (long)local_264 * 4);
        local_220 = &local_2c0;
        local_2c0 = 0;
        local_2b0 = 0;
        local_2a8 = 0;
        local_298 = 0;
        local_294 = 0;
        local_290 = 0;
        local_28c = 0;
        local_288 = 0;
        local_280 = 0;
        local_2b8 = 0;
        if (local_26c < local_274) {
          local_268 = local_270;
          local_26c = local_274;
        }
        local_48 = local_220;
        local_2a0 = local_150;
      }
      local_26c = sigmoid(0.0);
      if (local_23c <= local_26c) {
        local_178 = local_318;
        local_17c = local_25c;
        local_180 = 4;
        local_188 = 4;
        local_190 = 0;
        local_318._0_8_ = (void *)0x0;
        local_318._8_8_ = (Allocator *)0x0;
        local_318._16_8_ = (Allocator *)0x0;
        local_318._24_4_ = 0;
        local_2f8 = (long *)0x0;
        local_2f0._0_1_ = false;
        local_2f0._1_1_ = false;
        local_2f0._2_1_ = false;
        local_2f0._3_1_ = false;
        local_2ec = 0;
        local_2e8 = 0;
        local_2e4._0_1_ = false;
        local_2e4._1_1_ = false;
        local_2e4._2_1_ = false;
        local_2e4._3_1_ = false;
        local_2e0._0_1_ = false;
        local_2e0._1_1_ = false;
        local_2e0._2_1_ = false;
        local_2e0._3_1_ = false;
        local_2d8 = 0;
        ncnn::Mat::create(in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                          (int)in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                          (Allocator *)in_stack_fffffffffffffb58);
        for (local_31c = 0; local_31c < local_25c * 4; local_31c = local_31c + 1) {
          local_1ec = local_31c + 0x50;
          local_1e0 = &local_368;
          local_ec = *(int *)((long)local_228 + 0x2c);
          local_f0 = (int)local_228[6];
          local_f4 = *(undefined4 *)((long)local_228 + 0x34);
          local_100 = *local_228 + local_228[8] * (long)local_1ec * local_228[2];
          local_108 = local_228[2];
          local_10c = (undefined4)local_228[3];
          local_118 = (Allocator *)local_228[4];
          local_e8 = &local_368;
          local_d8 = (long)local_ec * (long)local_f0 * local_108;
          local_1a8 = &local_368;
          local_170 = (long)local_31c;
          local_168 = local_318;
          *(undefined4 *)(local_318._0_8_ + local_170 * 4) =
               *(undefined4 *)
                (local_100 + (long)local_ec * (long)local_260 * local_108 + (long)local_264 * 4);
          in_stack_fffffffffffffb70 = &local_368;
          local_dc = 0x10;
          local_1ac = local_260;
          local_1ed = 1;
          local_368.data = (void *)0x0;
          local_368.elemsize = 0;
          local_368.elempack = 0;
          local_368.dims = 0;
          local_368.w = 0;
          local_368.h = 0;
          local_368.d = 0;
          local_368.c = 0;
          local_368.cstep = 0;
          local_368.refcount = (int *)0x0;
          local_210 = in_stack_fffffffffffffb70;
          local_68 = in_stack_fffffffffffffb70;
          local_368.allocator = local_118;
        }
        in_stack_fffffffffffffb68 = ncnn::create_layer(in_stack_fffffffffffffb48);
        local_370 = in_stack_fffffffffffffb68;
        ncnn::ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffffb70);
        ncnn::ParamDict::set(&local_380,0,1);
        ncnn::ParamDict::set(&local_380,1,1);
        (*local_370->_vptr_Layer[2])(local_370,&local_380);
        ncnn::Option::Option(in_stack_fffffffffffffb50);
        local_3bc = 1;
        local_399 = 0;
        (*local_370->_vptr_Layer[4])(local_370,local_3c0);
        (*local_370->_vptr_Layer[9])(local_370,local_318,local_3c0);
        (*local_370->_vptr_Layer[5])(local_370,local_3c0);
        in_stack_fffffffffffffb60 = local_370;
        if (local_370 != (Layer *)0x0) {
          (*local_370->_vptr_Layer[1])();
        }
        ncnn::ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffffb50);
        for (local_3dc = 0; local_3dc < 4; local_3dc = local_3dc + 1) {
          local_3e0 = 0.0;
          local_158 = local_318;
          local_15c = local_3dc;
          in_stack_fffffffffffffb58 =
               (value_type *)
               (local_318._0_8_ + (long)local_2ec * (long)local_3dc * local_318._16_8_);
          for (local_3ec = 0; local_3ec < local_25c; local_3ec = local_3ec + 1) {
            local_3e0 = (float)local_3ec *
                        *(float *)((long)&(in_stack_fffffffffffffb58->rect).x + (long)local_3ec * 4)
                        + local_3e0;
          }
          local_3d8[local_3dc] = local_3e0 * (float)local_22c;
        }
        Object::Object((Object *)0x163e37);
        std::vector<Object,_std::allocator<Object>_>::push_back
                  ((vector<Object,_std::allocator<Object>_> *)in_stack_fffffffffffffb60,
                   in_stack_fffffffffffffb58);
        in_stack_fffffffffffffb50 = (Option *)local_318;
        local_200 = in_stack_fffffffffffffb50;
        local_88 = in_stack_fffffffffffffb50;
        if ((Allocator *)local_318._8_8_ != (Allocator *)0x0) {
          local_8c = 0xffffffff;
          LOCK();
          local_90 = *(int *)(_func_int ***)local_318._8_8_;
          *(int *)(_func_int ***)local_318._8_8_ = *(int *)(_func_int ***)local_318._8_8_ + -1;
          UNLOCK();
          if (local_90 == 1) {
            if (local_2f8 == (long *)0x0) {
              local_20 = (void *)local_318._0_8_;
              if ((void *)local_318._0_8_ != (void *)0x0) {
                free((void *)local_318._0_8_);
              }
            }
            else {
              (**(code **)(*local_2f8 + 0x18))(local_2f8,local_318._0_8_);
            }
          }
        }
        in_stack_fffffffffffffb50->lightmode = false;
        *(undefined3 *)&in_stack_fffffffffffffb50->field_0x1 = 0;
        in_stack_fffffffffffffb50->num_threads = 0;
        in_stack_fffffffffffffb50->workspace_allocator = (Allocator *)0x0;
        in_stack_fffffffffffffb50->openmp_blocktime = 0;
        in_stack_fffffffffffffb50->use_shader_pack8 = false;
        in_stack_fffffffffffffb50->use_subgroup_basic = false;
        in_stack_fffffffffffffb50->use_subgroup_vote = false;
        in_stack_fffffffffffffb50->use_subgroup_ballot = false;
        in_stack_fffffffffffffb50->use_subgroup_shuffle = false;
        in_stack_fffffffffffffb50->use_image_storage = false;
        in_stack_fffffffffffffb50->use_tensor_storage = false;
        in_stack_fffffffffffffb50->use_reserved_0 = false;
        in_stack_fffffffffffffb50->flush_denormals = 0;
        in_stack_fffffffffffffb50->use_local_pool_allocator = false;
        in_stack_fffffffffffffb50->use_shader_local_memory = false;
        in_stack_fffffffffffffb50->use_cooperative_matrix = false;
        in_stack_fffffffffffffb50->use_winograd23_convolution = false;
        in_stack_fffffffffffffb50->use_winograd43_convolution = false;
        in_stack_fffffffffffffb50->use_winograd63_convolution = false;
        in_stack_fffffffffffffb50->use_reserved_6 = false;
        in_stack_fffffffffffffb50->use_reserved_7 = false;
        in_stack_fffffffffffffb50[1].lightmode = false;
        *(undefined3 *)&in_stack_fffffffffffffb50[1].field_0x1 = 0;
        in_stack_fffffffffffffb50[1].num_threads = 0;
        in_stack_fffffffffffffb50->blob_allocator = (Allocator *)0x0;
      }
    }
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& pred, int stride, const ncnn::Mat& in_pad, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid = pred.h;

    int num_grid_x = pred.w;
    int num_grid_y = pred.h;

    const int num_class = 80; // number of classes. 80 for COCO
    const int reg_max_1 = (pred.c - num_class) / 4;

    for (int i = 0; i < num_grid_y; i++)
    {
        for (int j = 0; j < num_grid_x; j++)
        {
            // find label with max score
            int label = -1;
            float score = -FLT_MAX;
            for (int k = 0; k < num_class; k++)
            {
                float s = pred.channel(k).row(i)[j];
                if (s > score)
                {
                    label = k;
                    score = s;
                }
            }

            score = sigmoid(score);

            if (score >= prob_threshold)
            {
                ncnn::Mat bbox_pred(reg_max_1, 4);
                for (int k = 0; k < reg_max_1 * 4; k++)
                {
                    bbox_pred[k] = pred.channel(num_class + k).row(i)[j];
                }
                {
                    ncnn::Layer* softmax = ncnn::create_layer("Softmax");

                    ncnn::ParamDict pd;
                    pd.set(0, 1); // axis
                    pd.set(1, 1);
                    softmax->load_param(pd);

                    ncnn::Option opt;
                    opt.num_threads = 1;
                    opt.use_packing_layout = false;

                    softmax->create_pipeline(opt);

                    softmax->forward_inplace(bbox_pred, opt);

                    softmax->destroy_pipeline(opt);

                    delete softmax;
                }

                float pred_ltrb[4];
                for (int k = 0; k < 4; k++)
                {
                    float dis = 0.f;
                    const float* dis_after_sm = bbox_pred.row(k);
                    for (int l = 0; l < reg_max_1; l++)
                    {
                        dis += l * dis_after_sm[l];
                    }

                    pred_ltrb[k] = dis * stride;
                }

                float pb_cx = j * stride;
                float pb_cy = i * stride;

                float x0 = pb_cx - pred_ltrb[0];
                float y0 = pb_cy - pred_ltrb[1];
                float x1 = pb_cx + pred_ltrb[2];
                float y1 = pb_cy + pred_ltrb[3];

                Object obj;
                obj.rect.x = x0;
                obj.rect.y = y0;
                obj.rect.width = x1 - x0;
                obj.rect.height = y1 - y0;
                obj.label = label;
                obj.prob = score;

                objects.push_back(obj);
            }
        }
    }
}